

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_poll.c
# Opt level: O0

int luv_fs_poll_start(lua_State *L)

{
  int status;
  uv_fs_poll_t *handle_00;
  char *path_00;
  lua_Integer lVar1;
  int ret;
  uint interval;
  char *path;
  uv_fs_poll_t *handle;
  lua_State *L_local;
  
  handle_00 = luv_check_fs_poll(L,1);
  path_00 = luaL_checklstring(L,2,(size_t *)0x0);
  lVar1 = luaL_checkinteger(L,3);
  luv_check_callback(L,(luv_handle_t *)handle_00->data,1,4);
  status = uv_fs_poll_start(handle_00,luv_fs_poll_cb,path_00,(uint)lVar1);
  if (status < 0) {
    L_local._4_4_ = luv_error(L,status);
  }
  else {
    lua_pushinteger(L,(long)status);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_fs_poll_start(lua_State* L) {
  uv_fs_poll_t* handle = luv_check_fs_poll(L, 1);
  const char* path = luaL_checkstring(L, 2);
  unsigned int interval = luaL_checkinteger(L, 3);
  int ret;
  luv_check_callback(L, (luv_handle_t*)handle->data, LUV_FS_POLL, 4);
  ret = uv_fs_poll_start(handle, luv_fs_poll_cb, path, interval);
  return luv_result(L, ret);
}